

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dofhandler.h
# Opt level: O3

size_type __thiscall
lf::assemble::UniformFEDofHandler::NumInteriorDofs(UniformFEDofHandler *this,RefEl ref_el_type)

{
  runtime_error *this_00;
  stringstream ss;
  string local_200;
  string local_1e0;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  if ((byte)(ref_el_type.type_ - kPoint) < 4) {
    return *(size_type *)
            ((long)(&this->num_dofs_ + 1) + ((ulong)(byte)(ref_el_type.type_ - kPoint) + 2) * 4);
  }
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"Illegal entity type",0x13);
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"false","");
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_200,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/dofhandler.h"
             ,"");
  std::__cxx11::stringbuf::str();
  base::AssertionFailed(&local_1e0,&local_200,0x1d8,&local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"this code should not be reached");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

[[nodiscard]] size_type NumInteriorDofs(lf::base::RefEl ref_el_type) const {
    size_type no_loc_dofs;
    switch (ref_el_type) {
      case lf::base::RefEl::kPoint(): {
        no_loc_dofs = num_loc_dof_point_;
        break;
      }
      case lf::base::RefEl::kSegment(): {
        no_loc_dofs = num_loc_dof_segment_;
        break;
      }
      case lf::base::RefEl::kTria(): {
        no_loc_dofs = num_loc_dof_tria_;
        break;
      }
      case lf::base::RefEl::kQuad(): {
        no_loc_dofs = num_loc_dof_quad_;
        break;
      }
      default: {
        LF_VERIFY_MSG(false, "Illegal entity type");
        break;
      }
    }  // end switch
    return no_loc_dofs;
  }